

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_StatusCode UA_EndpointUrl_split(char *endpointUrl,char *hostname,UA_UInt16 *port,char **path)

{
  char cVar1;
  byte bVar2;
  char *__src;
  uint uVar3;
  UA_StatusCode UVar4;
  uint uVar5;
  long lVar6;
  char *__n;
  char *local_48;
  char *portTmp;
  char *pathTmp;
  char portStr [6];
  
  local_48 = (char *)0x0;
  portTmp = (char *)0x0;
  UVar4 = UA_EndpointUrl_split_ptr(endpointUrl,hostname,&local_48,&portTmp);
  __src = local_48;
  if (UVar4 != 0) {
    if (hostname == (char *)0x0) {
      return UVar4;
    }
    *hostname = '\0';
    return UVar4;
  }
  if (port == (UA_UInt16 *)0x0 && path == (char **)0x0) {
    return 0;
  }
  pathTmp._2_1_ = 0;
  if (local_48 == (char *)0x0) {
    if (port == (UA_UInt16 *)0x0) goto LAB_001140ac;
    uVar5 = 0;
  }
  else {
    if (portTmp == (char *)0x0) {
      __n = (char *)strlen(local_48);
    }
    else {
      __n = portTmp + ~(ulong)local_48;
    }
    if ((char *)0x5 < __n) {
      return 0x803c0000;
    }
    memcpy((void *)((long)&pathTmp + 2),__src,(size_t)__n);
    __n[(long)&pathTmp + 2] = '\0';
    if (port == (UA_UInt16 *)0x0) goto LAB_001140ac;
    lVar6 = 0;
    do {
      cVar1 = *(char *)((long)&pathTmp + lVar6 + 2);
      if (cVar1 == '\0') break;
      if ((byte)(cVar1 - 0x3aU) < 0xf6) {
        return 0x803c0000;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 6);
    lVar6 = 0;
    uVar3 = 0;
    do {
      uVar5 = uVar3;
      if (lVar6 == 6) break;
      bVar2 = *(byte *)((long)&pathTmp + lVar6 + 2);
      lVar6 = lVar6 + 1;
      uVar3 = ((uint)bVar2 + uVar5 * 10) - 0x30;
    } while (0xf5 < (byte)(bVar2 - 0x3a));
    if (0xffff < uVar5) {
      return 0x803c0000;
    }
  }
  *port = (UA_UInt16)uVar5;
LAB_001140ac:
  if (path != (char **)0x0) {
    *path = portTmp;
  }
  return 0;
}

Assistant:

UA_StatusCode
UA_EndpointUrl_split(const char *endpointUrl, char *hostname,
                     UA_UInt16 * port, const char ** path) {
    const char* portTmp = NULL;
    const char* pathTmp = NULL;
    UA_StatusCode retval = UA_EndpointUrl_split_ptr(endpointUrl, hostname, &portTmp, &pathTmp);
    if(retval != UA_STATUSCODE_GOOD) {
        if(hostname)
            hostname[0] = '\0';
        return retval;
    }
    if(!port && !path)
        return UA_STATUSCODE_GOOD;

    char portStr[6];
    portStr[0] = '\0';
    if(portTmp) {
        size_t portLen;
        if (pathTmp)
            portLen = (size_t)(pathTmp-portTmp-1);
        else
            portLen = strlen(portTmp);

        if (portLen > 5) // max is 65535
            return UA_STATUSCODE_BADOUTOFRANGE;

        memcpy(portStr, portTmp, portLen);
        portStr[portLen]='\0';

        if(port) {
            for (size_t i=0; i<6; ++i) {
                if (portStr[i] == 0)
                    break;
                if (portStr[i] < '0' || portStr[i] > '9')
                    return UA_STATUSCODE_BADOUTOFRANGE;
            }

            UA_UInt32 p;
            UA_readNumber((UA_Byte*)portStr, 6, &p);
            if (p>65535)
                return UA_STATUSCODE_BADOUTOFRANGE;
            *port = (UA_UInt16)p;
        }
    } else {
        if (port)
            *port = 0;
    }
    if (path)
        *path = pathTmp;
    return UA_STATUSCODE_GOOD;
}